

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O0

void __thiscall
CorUnix::CSynchData::WaiterEnqueue(CSynchData *this,WaitingThreadsListNode *pwtlnNewNode)

{
  _WaitingThreadsListNode *p_Var1;
  ObjectDomain OVar2;
  WaitingThreadsListNode *pwtlnCurrLast;
  WaitingThreadsListNode *pwtlnNewNode_local;
  CSynchData *this_local;
  
  OVar2 = GetObjectDomain(this);
  if (OVar2 != ProcessLocalObject) {
    fprintf(_stderr,"] %s %s:%d","WaiterEnqueue",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x71f);
    fprintf(_stderr,
            "Expression: ProcessLocalObject == GetObjectDomain(), Description: Trying to enqueue a WaitingThreadsListNode as local on a shared object\n"
           );
  }
  if ((pwtlnNewNode->dwFlags & 1) != 0) {
    fprintf(_stderr,"] %s %s:%d","WaiterEnqueue",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x722);
    fprintf(_stderr,
            "Expression: 0 == (WTLN_FLAG_OWNER_OBJECT_IS_SHARED & pwtlnNewNode->dwFlags), Description: Trying to add a WaitingThreadsListNode marked as shared as it was a local one\n"
           );
  }
  p_Var1 = (this->m_ptrWTLTail).ptr;
  (pwtlnNewNode->ptrNext).shrid = 0;
  if (p_Var1 == (_WaitingThreadsListNode *)0x0) {
    if ((this->m_ptrWTLHead).shrid != 0) {
      fprintf(_stderr,"] %s %s:%d","WaiterEnqueue",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x72b);
      fprintf(_stderr,
              "Expression: NULL == m_ptrWTLHead.ptr, Description: Corrupted waiting list on local CSynchData @ %p\n"
              ,this);
    }
    (pwtlnNewNode->ptrPrev).shrid = 0;
    (this->m_ptrWTLHead).ptr = pwtlnNewNode;
    (this->m_ptrWTLTail).ptr = pwtlnNewNode;
  }
  else {
    (pwtlnNewNode->ptrPrev).ptr = p_Var1;
    (p_Var1->ptrNext).ptr = pwtlnNewNode;
    (this->m_ptrWTLTail).ptr = pwtlnNewNode;
  }
  this->m_ulcWaitingThreads = this->m_ulcWaitingThreads + 1;
  return;
}

Assistant:

void CSynchData::WaiterEnqueue(WaitingThreadsListNode * pwtlnNewNode)
    {
        VALIDATEOBJECT(this);
        VALIDATEOBJECT(pwtlnNewNode);

        _ASSERT_MSG(ProcessLocalObject == GetObjectDomain(),
                    "Trying to enqueue a WaitingThreadsListNode as local "
                    "on a shared object\n");
        _ASSERT_MSG(0 == (WTLN_FLAG_OWNER_OBJECT_IS_SHARED & pwtlnNewNode->dwFlags),
                    "Trying to add a WaitingThreadsListNode marked as shared "
                    "as it was a local one\n");

        WaitingThreadsListNode * pwtlnCurrLast = m_ptrWTLTail.ptr;

        pwtlnNewNode->ptrNext.ptr = NULL;
        if (NULL == pwtlnCurrLast)
        {
            _ASSERT_MSG(NULL == m_ptrWTLHead.ptr,
                        "Corrupted waiting list on local CSynchData @ %p\n", 
                        this);
                
            pwtlnNewNode->ptrPrev.ptr = NULL;
            m_ptrWTLHead.ptr = pwtlnNewNode;
            m_ptrWTLTail.ptr = pwtlnNewNode;
        }
        else
        {
            VALIDATEOBJECT(pwtlnCurrLast);
            
            pwtlnNewNode->ptrPrev.ptr = pwtlnCurrLast;
            pwtlnCurrLast->ptrNext.ptr = pwtlnNewNode;                
            m_ptrWTLTail.ptr = pwtlnNewNode;
        }

        m_ulcWaitingThreads += 1;
        
        return;
    }